

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  U32 hBits;
  U32 hBits_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  int iVar8;
  BYTE *pBVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  uint uVar15;
  U32 UVar16;
  BYTE *iEnd;
  BYTE *pBVar17;
  BYTE *iStart;
  BYTE *pBVar18;
  BYTE *pBVar19;
  size_t sVar20;
  size_t sVar21;
  U64 UVar22;
  U64 UVar23;
  bool bVar24;
  BYTE *local_298;
  BYTE *local_288;
  BYTE *local_238;
  BYTE *local_220;
  BYTE *local_208;
  BYTE *local_1f8;
  BYTE *local_1e0;
  BYTE *local_1d0;
  BYTE *local_1c8;
  BYTE *local_1c0;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  BYTE *lowMatchPtr_2;
  BYTE *matchEnd_2;
  BYTE *lowMatchPtr_1;
  BYTE *matchEnd_1;
  BYTE *pBStack_168;
  U32 offset_3;
  BYTE *match3;
  BYTE *match3Base;
  U32 matchIndex3;
  size_t h3;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd;
  size_t mLength;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *matchLong;
  BYTE *matchLongBase;
  U32 matchLongIndex;
  size_t hLong;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t hSmall;
  U32 offset_2;
  U32 offset_1;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  BYTE *prefixStart;
  BYTE *base;
  U32 prefixStartIndex;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar4 = ms->hashTable;
  hBits = (ms->cParams).hashLog;
  pUVar5 = ms->chainTable;
  hBits_00 = (ms->cParams).chainLog;
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar17 = iEnd + -8;
  uVar1 = (ms->window).dictLimit;
  pBVar6 = (ms->window).base;
  iStart = pBVar6 + uVar1;
  uVar2 = (ms->window).lowLimit;
  pBVar7 = (ms->window).dictBase;
  pBVar18 = pBVar7 + uVar2;
  pBVar19 = pBVar7 + uVar1;
  hSmall._4_4_ = *rep;
  hSmall._0_4_ = rep[1];
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
LAB_00726db3:
  do {
    UVar10 = hSmall._4_4_;
    if (pBVar17 <= anchor) {
      *rep = hSmall._4_4_;
      rep[1] = (U32)hSmall;
      return (long)iEnd - (long)iend;
    }
    sVar20 = ZSTD_hashPtr(anchor,hBits_00,mls);
    uVar15 = pUVar5[sVar20];
    local_1c0 = pBVar6;
    if (uVar15 < uVar1) {
      local_1c0 = pBVar7;
    }
    hLong = (size_t)(local_1c0 + uVar15);
    sVar21 = ZSTD_hashPtr(anchor,hBits,8);
    uVar3 = pUVar4[sVar21];
    local_1c8 = pBVar6;
    if (uVar3 < uVar1) {
      local_1c8 = pBVar7;
    }
    _repIndex = local_1c8 + uVar3;
    iVar8 = (int)pBVar6;
    uVar11 = (int)anchor - iVar8;
    uVar12 = (uVar11 + 1) - hSmall._4_4_;
    local_1d0 = pBVar6;
    if (uVar12 < uVar1) {
      local_1d0 = pBVar7;
    }
    pUVar4[sVar21] = uVar11;
    pUVar5[sVar20] = uVar11;
    if (2 < (uVar1 - 1) - uVar12 && uVar2 < uVar12) {
      UVar13 = MEM_read32(local_1d0 + uVar12);
      UVar14 = MEM_read32(anchor + 1);
      if (UVar13 != UVar14) goto LAB_00727064;
      local_1e0 = iEnd;
      if (uVar12 < uVar1) {
        local_1e0 = pBVar19;
      }
      sVar20 = ZSTD_count_2segments(anchor + 5,local_1d0 + uVar12 + 4,iEnd,local_1e0,iStart);
      repMatchEnd = (BYTE *)(sVar20 + 4);
      anchor = anchor + 1;
      ZSTD_storeSeq(seqStore,(long)anchor - (long)iend,iend,0,sVar20 + 1);
LAB_0072766c:
      iend = repMatchEnd + (long)anchor;
      anchor = iend;
      if (iend <= pBVar17) {
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,hBits_00,mls);
        pUVar5[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,hBits,8);
        pUVar4[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(iend + -2,hBits_00,mls);
        pUVar5[sVar20] = ((int)iend + -2) - iVar8;
        sVar20 = ZSTD_hashPtr(iend + -2,hBits,8);
        pUVar4[sVar20] = ((int)iend + -2) - iVar8;
        for (; UVar10 = (U32)hSmall, iend = anchor, anchor <= pBVar17; anchor = anchor + sVar20 + 4)
        {
          UVar13 = (int)anchor - iVar8;
          uVar15 = UVar13 - (U32)hSmall;
          if (uVar15 < uVar1) {
            local_288 = pBVar7 + uVar15;
          }
          else {
            local_288 = pBVar6 + uVar15;
          }
          if ((uVar1 - 1) - uVar15 < 3 || uVar15 <= uVar2) break;
          UVar14 = MEM_read32(local_288);
          UVar16 = MEM_read32(anchor);
          if (UVar14 != UVar16) break;
          local_298 = iEnd;
          if (uVar15 < uVar1) {
            local_298 = pBVar19;
          }
          sVar20 = ZSTD_count_2segments(anchor + 4,local_288 + 4,iEnd,local_298,iStart);
          hSmall._0_4_ = hSmall._4_4_;
          hSmall._4_4_ = UVar10;
          ZSTD_storeSeq(seqStore,0,anchor,0,sVar20 + 1);
          sVar21 = ZSTD_hashPtr(anchor,hBits_00,mls);
          pUVar5[sVar21] = UVar13;
          sVar21 = ZSTD_hashPtr(anchor,hBits,8);
          pUVar4[sVar21] = UVar13;
        }
      }
      goto LAB_00726db3;
    }
LAB_00727064:
    if (uVar2 < uVar3) {
      UVar22 = MEM_read64(_repIndex);
      UVar23 = MEM_read64(anchor);
      if (UVar22 != UVar23) goto LAB_0072723a;
      local_1f8 = iStart;
      pBVar9 = iEnd;
      if (uVar3 < uVar1) {
        local_1f8 = pBVar18;
        pBVar9 = pBVar19;
      }
      sVar20 = ZSTD_count_2segments(anchor + 8,_repIndex + 8,iEnd,pBVar9,iStart);
      repMatchEnd = (BYTE *)(sVar20 + 8);
      hSmall._4_4_ = uVar11 - uVar3;
      while( true ) {
        bVar24 = false;
        if (iend < anchor && local_1f8 < _repIndex) {
          bVar24 = anchor[-1] == _repIndex[-1];
        }
        if (!bVar24) break;
        anchor = anchor + -1;
        _repIndex = _repIndex + -1;
        repMatchEnd = repMatchEnd + 1;
      }
      ZSTD_storeSeq(seqStore,(long)anchor - (long)iend,iend,hSmall._4_4_ + 2,
                    (size_t)(repMatchEnd + -3));
LAB_0072766a:
      hSmall._0_4_ = UVar10;
      goto LAB_0072766c;
    }
LAB_0072723a:
    if (uVar2 < uVar15) {
      UVar13 = MEM_read32((void *)hLong);
      UVar14 = MEM_read32(anchor);
      if (UVar13 == UVar14) {
        sVar20 = ZSTD_hashPtr(anchor + 1,hBits,8);
        uVar3 = pUVar4[sVar20];
        local_208 = pBVar6;
        if (uVar3 < uVar1) {
          local_208 = pBVar7;
        }
        pBStack_168 = local_208 + uVar3;
        pUVar4[sVar20] = uVar11 + 1;
        if (uVar2 < uVar3) {
          UVar22 = MEM_read64(pBStack_168);
          UVar23 = MEM_read64(anchor + 1);
          if (UVar22 != UVar23) goto LAB_007274b4;
          local_220 = iStart;
          pBVar9 = iEnd;
          if (uVar3 < uVar1) {
            local_220 = pBVar18;
            pBVar9 = pBVar19;
          }
          sVar20 = ZSTD_count_2segments(anchor + 9,pBStack_168 + 8,iEnd,pBVar9,iStart);
          repMatchEnd = (BYTE *)(sVar20 + 8);
          anchor = anchor + 1;
          matchEnd_1._4_4_ = (uVar11 + 1) - uVar3;
          while( true ) {
            bVar24 = false;
            if (iend < anchor && local_220 < pBStack_168) {
              bVar24 = anchor[-1] == pBStack_168[-1];
            }
            if (!bVar24) break;
            anchor = anchor + -1;
            pBStack_168 = pBStack_168 + -1;
            repMatchEnd = repMatchEnd + 1;
          }
        }
        else {
LAB_007274b4:
          local_238 = iStart;
          pBVar9 = iEnd;
          if (uVar15 < uVar1) {
            local_238 = pBVar18;
            pBVar9 = pBVar19;
          }
          sVar20 = ZSTD_count_2segments(anchor + 4,(BYTE *)(hLong + 4),iEnd,pBVar9,iStart);
          repMatchEnd = (BYTE *)(sVar20 + 4);
          matchEnd_1._4_4_ = uVar11 - uVar15;
          while( true ) {
            bVar24 = false;
            if (iend < anchor && local_238 < hLong) {
              bVar24 = anchor[-1] == *(BYTE *)(hLong - 1);
            }
            if (!bVar24) break;
            anchor = anchor + -1;
            hLong = hLong - 1;
            repMatchEnd = repMatchEnd + 1;
          }
        }
        hSmall._4_4_ = matchEnd_1._4_4_;
        ZSTD_storeSeq(seqStore,(long)anchor - (long)iend,iend,matchEnd_1._4_4_ + 2,
                      (size_t)(repMatchEnd + -3));
        goto LAB_0072766a;
      }
    }
    anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const base = ms->window.base;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashSmall[ZSTD_hashPtr(base+current+2, hBitsS, mls)] = current+2;
            hashLong[ZSTD_hashPtr(base+current+2, hBitsL, 8)] = current+2;
            hashSmall[ZSTD_hashPtr(ip-2, hBitsS, mls)] = (U32)(ip-2-base);
            hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}